

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void print(json_value *value,int indent)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  json_value *value_00;
  bool bVar4;
  
  iVar2 = indent;
  if (0 < indent) {
    do {
      printf("    ");
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  if (value->name != (char *)0x0) {
    printf("\"%s\" = ");
  }
  switch(value->type) {
  case JSON_NULL:
    puts("null");
    return;
  case JSON_OBJECT:
  case JSON_ARRAY:
    pcVar3 = "[\n";
    if (value->type == JSON_OBJECT) {
      pcVar3 = "{\n";
    }
    printf(pcVar3);
    value_00 = value->first_child;
    if (value_00 != (json_value *)0x0) {
      do {
        print(value_00,indent + 1);
        value_00 = value_00->next_sibling;
      } while (value_00 != (json_value *)0x0);
    }
    if (0 < indent) {
      do {
        printf("    ");
        indent = indent + -1;
      } while (indent != 0);
    }
    bVar4 = value->type == JSON_OBJECT;
    pcVar1 = "}\n";
    pcVar3 = "]\n";
    break;
  case JSON_STRING:
    printf("\"%s\"\n",(value->field_5).string_value);
    return;
  case JSON_INT:
    printf("%d\n",(ulong)(uint)(value->field_5).int_value);
    return;
  case JSON_FLOAT:
    printf("%f\n",(double)(value->field_5).float_value);
    return;
  case JSON_BOOL:
    bVar4 = (value->field_5).int_value == 0;
    pcVar1 = "false\n";
    pcVar3 = "true\n";
    break;
  default:
    return;
  }
  if (bVar4) {
    pcVar3 = pcVar1;
  }
  printf(pcVar3);
  return;
}

Assistant:

void print(json_value *value, int indent = 0)
{
	INDENT(indent);
	if (value->name) printf("\"%s\" = ", value->name);
	switch(value->type)
	{
	case JSON_NULL:
		printf("null\n");
		break;
	case JSON_OBJECT:
	case JSON_ARRAY:
		printf(value->type == JSON_OBJECT ? "{\n" : "[\n");
		for (json_value *it = value->first_child; it; it = it->next_sibling)
		{
			print(it, indent + 1);
		}
		INDENT(indent);
		printf(value->type == JSON_OBJECT ? "}\n" : "]\n");
		break;
	case JSON_STRING:
		printf("\"%s\"\n", value->string_value);
		break;
	case JSON_INT:
		printf("%d\n", value->int_value);
		break;
	case JSON_FLOAT:
		printf("%f\n", value->float_value);
		break;
	case JSON_BOOL:
		printf(value->int_value ? "true\n" : "false\n");
		break;
	}
}